

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::deinit(GeometryShader_gl_in_ArrayLengthTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  _Elt_pointer ppCVar3;
  _Elt_pointer ppCVar4;
  _Map_pointer pppCVar5;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0xd8))(0);
  (**(code **)(lVar2 + 0x48))(0x8c8e,0,0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object_id);
  }
  if (this->m_buffer_object_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_buffer_object_id);
  }
  ppCVar4 = (this->m_tests).
            super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppCVar4 !=
      (this->m_tests).
      super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppCVar3 = (this->m_tests).
              super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppCVar5 = (this->m_tests).
               super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      deinitCase(this,*ppCVar4);
      ppCVar4 = ppCVar4 + 1;
      if (ppCVar4 == ppCVar3) {
        ppCVar4 = pppCVar5[1];
        pppCVar5 = pppCVar5 + 1;
        ppCVar3 = ppCVar4 + 0x40;
      }
    } while (ppCVar4 !=
             (this->m_tests).
             super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::clear(&this->m_tests);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default values */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, 0 /* id */);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Delete everything */
	if (0 != m_vertex_array_object_id)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
	}

	if (0 != m_buffer_object_id)
	{
		gl.deleteBuffers(1, &m_buffer_object_id);
	}

	/* Deinit test cases */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		Case* test = *it;

		deinitCase(*test);
	}

	m_tests.clear();

	/* Deinitialize Base */
	TestCaseBase::deinit();
}